

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O3

optional<unsigned_int> qt_get_hex_rgb(char *name)

{
  size_t len;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  optional<QRgba64> oVar4;
  
  if (name == (char *)0x0) {
    len = 0;
  }
  else {
    len = strlen(name);
  }
  oVar4 = get_hex_rgb(name,len);
  if (((undefined1  [16])
       oVar4.super__Optional_base<QRgba64,_true,_true>._M_payload.
       super__Optional_payload_base<QRgba64> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar3 = 0;
    uVar1 = 0;
  }
  else {
    uVar3 = ((ulong)oVar4.super__Optional_base<QRgba64,_true,_true>._M_payload.
                    super__Optional_payload_base<QRgba64>._M_payload & 0xffff0000ffff) +
            0x8000000080;
    uVar1 = ((ulong)oVar4.super__Optional_base<QRgba64,_true,_true>._M_payload.
                    super__Optional_payload_base<QRgba64>._M_payload >> 0x10 & 0xffff0000ffff) +
            0x8000000080;
    uVar3 = uVar3 - (uVar3 >> 8 & 0x1ff000001ff);
    lVar2 = uVar1 - (uVar1 >> 8 & 0x1ff000001ff);
    uVar3 = uVar3 >> 0x28 & 0xff | (ulong)((uint)lVar2 & 0xff00 | ((uint)uVar3 & 0xff00) << 8) |
            (ulong)((uint)((ulong)lVar2 >> 0x10) & 0xff000000);
    uVar1 = 0x100000000;
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar3 | uVar1);
}

Assistant:

std::optional<QRgb> qt_get_hex_rgb(const char *name)
{
    if (std::optional<QRgba64> rgba64 = get_hex_rgb(name, qstrlen(name)))
        return rgba64->toArgb32();
    return std::nullopt;
}